

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxConcat::Emit(FxConcat *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  ExpEmit EVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar3;
  int local_a0;
  int local_9c;
  int local_90;
  int local_8c;
  ExpEmit local_78;
  ExpEmit nonconst_1;
  int local_68;
  ExpEmit EStack_64;
  int cast_1;
  ExpEmit local_5c;
  ExpEmit nonconst;
  int local_4c;
  ExpEmit EStack_48;
  int cast;
  ExpEmit local_40;
  ExpEmit strng2;
  ExpEmit strng;
  ExpEmit op2;
  ExpEmit op1;
  VMFunctionBuilder *build_local;
  FxConcat *this_local;
  ExpEmit dest;
  
  pFVar1 = (this->super_FxBinary).left;
  op2._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  op2.Konst = (bool)(char)extraout_var;
  op2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  op2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  op2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  pFVar1 = (this->super_FxBinary).right;
  strng._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  strng.Konst = (bool)(char)extraout_var_00;
  strng.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
  strng.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
  strng.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
  ExpEmit::ExpEmit(&strng2);
  ExpEmit::ExpEmit(&local_40);
  if ((op2.RegType == '\x02') && (((ulong)op2 & 0x100000000) != 0)) {
    ExpEmit::ExpEmit(&stack0xffffffffffffffb8,build,2,1);
    strng2 = EStack_48;
    EVar2 = strng2;
    strng2.RegNum = EStack_48.RegNum;
    uVar3 = (uint)strng2.RegNum;
    strng2 = EVar2;
    VMFunctionBuilder::Emit(build,4,uVar3,op2.RegNum);
  }
  else if (op2.RegType == '\x02') {
    strng2 = op2;
  }
  else {
    ExpEmit::ExpEmit(&nonconst,build,2,1);
    strng2 = nonconst;
    if (((ulong)op2 & 0x100000000) != 0) {
      ExpEmit::ExpEmit(&local_5c,build,(uint)op2.RegType,1);
      if (op2.RegType == '\0') {
        local_8c = 2;
      }
      else {
        local_8c = 5;
        if (op2.RegType == '\x01') {
          local_8c = 3;
        }
      }
      VMFunctionBuilder::Emit(build,local_8c,(uint)local_5c.RegNum,op2.RegNum);
      op2.RegType = local_5c.RegType;
      op2.RegCount = local_5c.RegCount;
      op2.Konst = local_5c.Konst;
      op2.Fixed = local_5c.Fixed;
      op2.Final = local_5c.Final;
      op2.Target = local_5c.Target;
      op2.RegNum = local_5c.RegNum;
    }
    if (op2.RegType == '\x01') {
      if (op2.RegCount == '\x01') {
        local_90 = 6;
      }
      else {
        local_90 = 0x11;
        if (op2.RegCount == '\x02') {
          local_90 = 0x10;
        }
      }
      local_4c = local_90;
    }
    else if (((this->super_FxBinary).left)->ValueType == (PType *)TypeUInt32) {
      local_4c = 3;
    }
    else if (((this->super_FxBinary).left)->ValueType == (PType *)TypeName) {
      local_4c = 0xb;
    }
    else if (((this->super_FxBinary).left)->ValueType == (PType *)TypeSound) {
      local_4c = 0xf;
    }
    else if (((this->super_FxBinary).left)->ValueType == (PType *)TypeColor) {
      local_4c = 0xe;
    }
    else if (((this->super_FxBinary).left)->ValueType == (PType *)TypeSpriteID) {
      local_4c = 0x12;
    }
    else if (((this->super_FxBinary).left)->ValueType == (PType *)TypeTextureID) {
      local_4c = 0x13;
    }
    else if (op2.RegType == '\x03') {
      local_4c = 7;
    }
    else {
      if (op2.RegType != '\0') {
        __assert_fail("false && \"Bad type for string concatenation\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0xf9c,"virtual ExpEmit FxConcat::Emit(VMFunctionBuilder *)");
      }
      local_4c = 1;
    }
    VMFunctionBuilder::Emit(build,0x3e,(uint)strng2.RegNum,(uint)op2.RegNum,local_4c);
    ExpEmit::Free(&op2,build);
  }
  if ((strng.RegType == '\x02') && (((ulong)strng & 0x100000000) != 0)) {
    ExpEmit::ExpEmit(&stack0xffffffffffffff9c,build,2,1);
    local_40 = EStack_64;
    EVar2 = local_40;
    local_40.RegNum = EStack_64.RegNum;
    uVar3 = (uint)local_40.RegNum;
    local_40 = EVar2;
    VMFunctionBuilder::Emit(build,4,uVar3,strng.RegNum);
  }
  else if (strng.RegType == '\x02') {
    local_40 = strng;
  }
  else {
    ExpEmit::ExpEmit(&nonconst_1,build,2,1);
    local_40 = nonconst_1;
    if (((ulong)strng & 0x100000000) != 0) {
      ExpEmit::ExpEmit(&local_78,build,(uint)strng.RegType,1);
      if (strng.RegType == '\0') {
        local_9c = 2;
      }
      else {
        local_9c = 5;
        if (strng.RegType == '\x01') {
          local_9c = 3;
        }
      }
      VMFunctionBuilder::Emit(build,local_9c,(uint)local_78.RegNum,strng.RegNum);
      strng.RegType = local_78.RegType;
      strng.RegCount = local_78.RegCount;
      strng.Konst = local_78.Konst;
      strng.Fixed = local_78.Fixed;
      strng.Final = local_78.Final;
      strng.Target = local_78.Target;
      strng.RegNum = local_78.RegNum;
    }
    if (strng.RegType == '\x01') {
      if (strng.RegCount == '\x01') {
        local_a0 = 6;
      }
      else {
        local_a0 = 0x11;
        if (strng.RegCount == '\x02') {
          local_a0 = 0x10;
        }
      }
      local_68 = local_a0;
    }
    else if (((this->super_FxBinary).right)->ValueType == (PType *)TypeUInt32) {
      local_68 = 3;
    }
    else if (((this->super_FxBinary).right)->ValueType == (PType *)TypeName) {
      local_68 = 0xb;
    }
    else if (((this->super_FxBinary).right)->ValueType == (PType *)TypeSound) {
      local_68 = 0xf;
    }
    else if (((this->super_FxBinary).right)->ValueType == (PType *)TypeColor) {
      local_68 = 0xe;
    }
    else if (((this->super_FxBinary).right)->ValueType == (PType *)TypeSpriteID) {
      local_68 = 0x12;
    }
    else if (((this->super_FxBinary).right)->ValueType == (PType *)TypeTextureID) {
      local_68 = 0x13;
    }
    else if (strng.RegType == '\x03') {
      local_68 = 7;
    }
    else {
      if (strng.RegType != '\0') {
        __assert_fail("false && \"Bad type for string concatenation\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0xfbd,"virtual ExpEmit FxConcat::Emit(VMFunctionBuilder *)");
      }
      local_68 = 1;
    }
    VMFunctionBuilder::Emit(build,0x3e,(uint)local_40.RegNum,(uint)strng.RegNum,local_68);
    ExpEmit::Free(&strng,build);
  }
  ExpEmit::Free(&strng2,build);
  ExpEmit::Free(&local_40,build);
  ExpEmit::ExpEmit((ExpEmit *)&this_local,build,2,1);
  if (strng2.RegType != local_40.RegType || strng2.RegType != '\x02') {
    __assert_fail("strng.RegType == strng2.RegType && strng.RegType == REGT_STRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xfc4,"virtual ExpEmit FxConcat::Emit(VMFunctionBuilder *)");
  }
  VMFunctionBuilder::Emit
            (build,0x57,(uint)(ushort)this_local,(uint)strng2.RegNum,(uint)local_40.RegNum);
  EVar2.RegType = this_local._2_1_;
  EVar2.RegCount = this_local._3_1_;
  EVar2.Konst = (bool)this_local._4_1_;
  EVar2.Fixed = (bool)this_local._5_1_;
  EVar2.Final = (bool)this_local._6_1_;
  EVar2.Target = (bool)this_local._7_1_;
  EVar2.RegNum = (ushort)this_local;
  return EVar2;
}

Assistant:

ExpEmit FxConcat::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	ExpEmit strng, strng2;

	if (op1.RegType == REGT_STRING && op1.Konst)
	{
		strng = ExpEmit(build, REGT_STRING);
		build->Emit(OP_LKS, strng.RegNum, op1.RegNum);
	}
	else if (op1.RegType == REGT_STRING)
	{
		strng = op1;
	}
	else
	{
		int cast;
		strng = ExpEmit(build, REGT_STRING);
		if (op1.Konst)
		{
			ExpEmit nonconst(build, op1.RegType);
			build->Emit(op1.RegType == REGT_INT ? OP_LK : op1.RegType == REGT_FLOAT ? OP_LKF : OP_LKP, nonconst.RegNum, op1.RegNum);
			op1 = nonconst;
		}
		if (op1.RegType == REGT_FLOAT) cast = op1.RegCount == 1 ? CAST_F2S : op1.RegCount == 2 ? CAST_V22S : CAST_V32S;
		else if (left->ValueType == TypeUInt32) cast = CAST_U2S;
		else if (left->ValueType == TypeName) cast = CAST_N2S;
		else if (left->ValueType == TypeSound) cast = CAST_So2S;
		else if (left->ValueType == TypeColor) cast = CAST_Co2S;
		else if (left->ValueType == TypeSpriteID) cast = CAST_SID2S;
		else if (left->ValueType == TypeTextureID) cast = CAST_TID2S;
		else if (op1.RegType == REGT_POINTER) cast = CAST_P2S;
		else if (op1.RegType == REGT_INT) cast = CAST_I2S;
		else assert(false && "Bad type for string concatenation");
		build->Emit(OP_CAST, strng.RegNum, op1.RegNum, cast);
		op1.Free(build);
	}

	if (op2.RegType == REGT_STRING && op2.Konst)
	{
		strng2 = ExpEmit(build, REGT_STRING);
		build->Emit(OP_LKS, strng2.RegNum, op2.RegNum);
	}
	else if (op2.RegType == REGT_STRING)
	{
		strng2 = op2;
	}
	else
	{
		int cast;
		strng2 = ExpEmit(build, REGT_STRING);
		if (op2.Konst)
		{
			ExpEmit nonconst(build, op2.RegType);
			build->Emit(op2.RegType == REGT_INT ? OP_LK : op2.RegType == REGT_FLOAT ? OP_LKF : OP_LKP, nonconst.RegNum, op2.RegNum);
			op2 = nonconst;
		}
		if (op2.RegType == REGT_FLOAT) cast = op2.RegCount == 1 ? CAST_F2S : op2.RegCount == 2 ? CAST_V22S : CAST_V32S;
		else if (right->ValueType == TypeUInt32) cast = CAST_U2S;
		else if (right->ValueType == TypeName) cast = CAST_N2S;
		else if (right->ValueType == TypeSound) cast = CAST_So2S;
		else if (right->ValueType == TypeColor) cast = CAST_Co2S;
		else if (right->ValueType == TypeSpriteID) cast = CAST_SID2S;
		else if (right->ValueType == TypeTextureID) cast = CAST_TID2S;
		else if (op2.RegType == REGT_POINTER) cast = CAST_P2S;
		else if (op2.RegType == REGT_INT) cast = CAST_I2S;
		else assert(false && "Bad type for string concatenation");
		build->Emit(OP_CAST, strng2.RegNum, op2.RegNum, cast);
		op2.Free(build);
	}
	strng.Free(build);
	strng2.Free(build);
	ExpEmit dest(build, REGT_STRING);
	assert(strng.RegType == strng2.RegType && strng.RegType == REGT_STRING);
	build->Emit(OP_CONCAT, dest.RegNum, strng.RegNum, strng2.RegNum);
	return dest;
}